

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dice.cpp
# Opt level: O3

void __thiscall Dice::lastDiceHistoricalResolvedValues(Dice *this)

{
  char *__s;
  long *plVar1;
  map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
  *pmVar2;
  size_t sVar3;
  _Base_ptr p_Var4;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Dice container values for player ",0x21);
  plVar1 = (long *)std::ostream::operator<<((ostream *)&std::cout,this->playerNumber);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "-----------------------------------------------------------------",0x41);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
  std::ostream::put(-0x30);
  std::ostream::flush();
  (this->it)._M_current =
       (this->historyOfResolvedRolls).
       super__Vector_base<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>,_std::allocator<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish + -1;
  do {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "-----------------------------------------------------------------",0x41);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
    std::ostream::put(-0x30);
    std::ostream::flush();
    pmVar2 = (this->it)._M_current;
    p_Var4 = (pmVar2->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    while ((_Rb_tree_header *)p_Var4 != &(pmVar2->_M_t)._M_impl.super__Rb_tree_header) {
      __s = this->DiceNames[p_Var4[1]._M_color];
      if (__s == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1281d0);
      }
      else {
        sVar3 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar3);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
      plVar1 = (long *)std::ostream::operator<<((ostream *)&std::cout,*(int *)&p_Var4[1].field_0x4);
      std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
      std::ostream::put((char)plVar1);
      std::ostream::flush();
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
      pmVar2 = (this->it)._M_current;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "-----------------------------------------------------------------",0x41);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
    std::ostream::put(-0x30);
    std::ostream::flush();
    pmVar2 = (this->it)._M_current + 1;
    (this->it)._M_current = pmVar2;
  } while (pmVar2 != (this->historyOfResolvedRolls).
                     super__Vector_base<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>,_std::allocator<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
  return;
}

Assistant:

void Dice::lastDiceHistoricalResolvedValues()
{
    cout << "Dice container values for player "<< this->getPlayerNumber() << endl;
    cout << "-----------------------------------------------------------------" << endl;
    for (it = historyOfResolvedRolls.end()-1; it != historyOfResolvedRolls.end(); ++it) {
        cout << "-----------------------------------------------------------------" << endl;

        for (auto mapIt(it->begin()); mapIt != it->end(); ++mapIt) {

            std::cout << DiceNames[mapIt->first] << ", " << mapIt->second << std::endl;
        }
        cout << "-----------------------------------------------------------------" << endl;

    }

}